

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O3

qint64 __thiscall
QHttpNetworkReplyPrivate::readReplyBodyChunked
          (QHttpNetworkReplyPrivate *this,QIODevice *socket,QByteDataBuffer *out)

{
  long lVar1;
  long lVar2;
  qint64 qVar3;
  long lVar4;
  long in_FS_OFFSET;
  char crlf [2];
  char crlf_1 [2];
  undefined2 local_3c;
  undefined2 local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (**(code **)(*(long *)socket + 0xa0))(socket);
  if (lVar1 == 0) {
    lVar1 = 0;
  }
  else {
    lVar1 = 0;
    do {
      if ((this->readBufferMaxSize != 0) && (this->readBufferMaxSize < lVar1)) break;
      lVar2 = this->currentChunkSize;
      if ((this->lastChunkRead == false) && (lVar2 <= this->currentChunkRead)) {
        this->currentChunkSize = 0;
        this->currentChunkRead = 0;
        if (lVar1 == 0) {
          lVar1 = 0;
        }
        else {
          local_3a = 0xaaaa;
          lVar2 = QIODevice::read((char *)socket,(longlong)&local_3a);
          if (lVar2 != 2) break;
          lVar1 = lVar1 + 2;
        }
        qVar3 = getChunkSize(this,socket,&this->currentChunkSize);
        lVar1 = qVar3 + lVar1;
        lVar2 = this->currentChunkSize;
        if (lVar2 == -1) break;
      }
      if ((lVar2 == 0) || (this->lastChunkRead == true)) {
        this->lastChunkRead = true;
        local_3c = 0xaaaa;
        lVar4 = QIODevice::read((char *)socket,(longlong)&local_3c);
        lVar2 = 0;
        if (0 < lVar4) {
          lVar2 = lVar4;
        }
        if ((((lVar4 == 2) && ((char)local_3c == '\r')) && (local_3c._1_1_ == '\n')) ||
           (lVar4 == 1 && (char)local_3c == '\n')) {
LAB_0020afae:
          this->state = AllDoneState;
        }
        else if ((0 < lVar4) && (lVar4 != 1 || (char)local_3c != '\r')) {
          this->forceConnectionCloseEnabled = true;
          goto LAB_0020afae;
        }
        lVar1 = lVar1 + lVar2;
        break;
      }
      qVar3 = readReplyBodyRaw(this,socket,out,lVar2 - this->currentChunkRead);
      this->currentChunkRead = this->currentChunkRead + qVar3;
      lVar1 = lVar1 + qVar3;
      lVar2 = (**(code **)(*(long *)socket + 0xa0))(socket);
    } while (lVar2 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return lVar1;
}

Assistant:

qint64 QHttpNetworkReplyPrivate::readReplyBodyChunked(QIODevice *socket, QByteDataBuffer *out)
{
    qint64 bytes = 0;
    while (socket->bytesAvailable()) {

        if (readBufferMaxSize && (bytes > readBufferMaxSize))
            break;

        if (!lastChunkRead && currentChunkRead >= currentChunkSize) {
            // For the first chunk and when we're done with a chunk
            currentChunkSize = 0;
            currentChunkRead = 0;
            if (bytes) {
                // After a chunk
                char crlf[2];
                // read the "\r\n" after the chunk
                qint64 haveRead = socket->read(crlf, 2);
                // FIXME: This code is slightly broken and not optimal. What if the 2 bytes are not available yet?!
                // For nice reasons (the toLong in getChunkSize accepting \n at the beginning
                // it right now still works, but we should definitely fix this.

                if (haveRead != 2)
                    return bytes; // FIXME
                bytes += haveRead;
            }
            // Note that chunk size gets stored in currentChunkSize, what is returned is the bytes read
            bytes += getChunkSize(socket, &currentChunkSize);
            if (currentChunkSize == -1)
                break;
        }
        // if the chunk size is 0, end of the stream
        if (currentChunkSize == 0 || lastChunkRead) {
            lastChunkRead = true;
            // try to read the "\r\n" after the chunk
            char crlf[2];
            qint64 haveRead = socket->read(crlf, 2);
            if (haveRead > 0)
                bytes += haveRead;

            if ((haveRead == 2 && crlf[0] == '\r' && crlf[1] == '\n') || (haveRead == 1 && crlf[0] == '\n'))
                state = AllDoneState;
            else if (haveRead == 1 && crlf[0] == '\r')
                break; // Still waiting for the last \n
            else if (haveRead > 0) {
                // If we read something else then CRLF, we need to close the channel.
                forceConnectionCloseEnabled = true;
                state = AllDoneState;
            }
            break;
        }

        // otherwise, try to begin reading this chunk / to read what is missing for this chunk
        qint64 haveRead = readReplyBodyRaw (socket, out, currentChunkSize - currentChunkRead);
        currentChunkRead += haveRead;
        bytes += haveRead;

        // ### error checking here

    }
    return bytes;
}